

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestValueTestobjects::runTestCase(TestValueTestobjects *this)

{
  Value *value;
  TestResult *pTVar1;
  bool bVar2;
  ValueType actual;
  Value *pVVar3;
  Value got;
  Value local_310;
  Value local_2e8;
  Value local_2c0;
  Value local_298;
  Value local_270;
  Value local_248;
  Value local_220;
  Value local_1f8;
  Value local_1d0;
  Value local_1a8;
  Value local_180;
  Value local_158;
  Value local_130;
  Value local_108;
  Value local_e0;
  Value local_b8;
  Value local_90;
  Value local_68;
  IsCheck local_3c;
  
  local_3c.isArray_ = false;
  local_3c.isBool_ = false;
  local_3c.isString_ = false;
  local_3c.isNull_ = false;
  local_3c.isInt_ = false;
  local_3c.isInt64_ = false;
  local_3c.isUInt_ = false;
  local_3c.isUInt64_ = false;
  local_3c.isIntegral_ = false;
  local_3c.isDouble_ = false;
  local_3c.isNumeric_ = false;
  local_3c.isObject_ = true;
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  got.value_.int_._0_4_ = pTVar1->predicateId_;
  got._8_8_ = anon_var_dwarf_d605;
  got.comments_._0_4_ = 0xa7;
  got.start_ = (size_t)anon_var_dwarf_d883;
  got.limit_ = 0;
  pTVar1->predicateStackTail_->next_ = (PredicateContext *)&got;
  pTVar1->predicateId_ = got.value_.int_._0_4_ + 1;
  pTVar1->predicateStackTail_ = (PredicateContext *)&got;
  pVVar3 = &(this->super_ValueTest).emptyObject_;
  ValueTest::checkIs(&this->super_ValueTest,pVVar3,&local_3c);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  got.value_.int_._0_4_ = pTVar1->predicateId_;
  got._8_8_ = anon_var_dwarf_d605;
  got.comments_._0_4_ = 0xa8;
  got.start_ = (size_t)anon_var_dwarf_d88d;
  got.limit_ = 0;
  pTVar1->predicateStackTail_->next_ = (PredicateContext *)&got;
  pTVar1->predicateId_ = got.value_.int_._0_4_ + 1;
  pTVar1->predicateStackTail_ = (PredicateContext *)&got;
  value = &(this->super_ValueTest).object1_;
  ValueTest::checkIs(&this->super_ValueTest,value,&local_3c);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  actual = Json::Value::type(pVVar3);
  JsonTest::checkEqual<Json::ValueType,Json::ValueType>
            (pTVar1,objectValue,actual,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0xaa,"Json::objectValue == emptyObject_.type()");
  bVar2 = Json::Value::isConvertibleTo(pVVar3,nullValue);
  if (!bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0xad,"emptyObject_.isConvertibleTo(Json::nullValue)");
  }
  bVar2 = Json::Value::isConvertibleTo(value,nullValue);
  if (bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0xb0,"!object1_.isConvertibleTo(Json::nullValue)");
  }
  bVar2 = Json::Value::isConvertibleTo(pVVar3,objectValue);
  if (!bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0xb3,"emptyObject_.isConvertibleTo(Json::objectValue)");
  }
  bVar2 = Json::Value::isConvertibleTo(pVVar3,arrayValue);
  if (bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0xb6,"!emptyObject_.isConvertibleTo(Json::arrayValue)");
  }
  bVar2 = Json::Value::isConvertibleTo(pVVar3,intValue);
  if (bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0xb7,"!emptyObject_.isConvertibleTo(Json::intValue)");
  }
  bVar2 = Json::Value::isConvertibleTo(pVVar3,uintValue);
  if (bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0xb8,"!emptyObject_.isConvertibleTo(Json::uintValue)");
  }
  bVar2 = Json::Value::isConvertibleTo(pVVar3,realValue);
  if (bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0xb9,"!emptyObject_.isConvertibleTo(Json::realValue)");
  }
  bVar2 = Json::Value::isConvertibleTo(pVVar3,booleanValue);
  if (bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0xba,"!emptyObject_.isConvertibleTo(Json::booleanValue)");
  }
  bVar2 = Json::Value::isConvertibleTo(pVVar3,stringValue);
  if (bVar2) {
    JsonTest::TestResult::addFailure
              ((this->super_ValueTest).super_TestCase.result_,
               "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
               ,0xbb,"!emptyObject_.isConvertibleTo(Json::stringValue)");
  }
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  Json::Value::Value(&local_68,0x4d2);
  pVVar3 = Json::Value::operator[](value,"id");
  Json::Value::Value(&local_90,pVVar3);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (pTVar1,&local_68,&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0xc0,"Json::Value(1234) == constObject[\"id\"]");
  Json::Value::~Value(&local_90);
  Json::Value::~Value(&local_68);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  Json::Value::Value(&local_b8,nullValue);
  pVVar3 = Json::Value::operator[](value,"unknown id");
  Json::Value::Value(&local_e0,pVVar3);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (pTVar1,&local_b8,&local_e0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0xc1,"Json::Value() == constObject[\"unknown id\"]");
  Json::Value::~Value(&local_e0);
  Json::Value::~Value(&local_b8);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  Json::Value::Value(&local_108,0x4d2);
  pVVar3 = Json::Value::operator[](value,"id");
  Json::Value::Value(&local_130,pVVar3);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (pTVar1,&local_108,&local_130,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0xc4,"Json::Value(1234) == object1_[\"id\"]");
  Json::Value::~Value(&local_130);
  Json::Value::~Value(&local_108);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  Json::Value::Value(&local_158,nullValue);
  pVVar3 = Json::Value::operator[](value,"unknown id");
  Json::Value::Value(&local_180,pVVar3);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (pTVar1,&local_158,&local_180,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0xc5,"Json::Value() == object1_[\"unknown id\"]");
  Json::Value::~Value(&local_180);
  Json::Value::~Value(&local_158);
  Json::Value::Value(&local_1a8,"foo");
  pVVar3 = Json::Value::operator[](value,"some other id");
  Json::Value::operator=(pVVar3,&local_1a8);
  Json::Value::~Value(&local_1a8);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  Json::Value::Value(&local_1d0,"foo");
  pVVar3 = Json::Value::operator[](value,"some other id");
  Json::Value::Value(&local_1f8,pVVar3);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (pTVar1,&local_1d0,&local_1f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,200,"Json::Value(\"foo\") == object1_[\"some other id\"]");
  Json::Value::~Value(&local_1f8);
  Json::Value::~Value(&local_1d0);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  Json::Value::Value(&local_220,"foo");
  pVVar3 = Json::Value::operator[](value,"some other id");
  Json::Value::Value(&local_248,pVVar3);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (pTVar1,&local_220,&local_248,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0xc9,"Json::Value(\"foo\") == object1_[\"some other id\"]");
  Json::Value::~Value(&local_248);
  Json::Value::~Value(&local_220);
  Json::Value::Value(&got,nullValue);
  bVar2 = Json::Value::removeMember(value,"some other id",&got);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  Json::Value::Value(&local_270,"foo");
  Json::Value::Value(&local_298,&got);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (pTVar1,&local_270,&local_298,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0xcf,"Json::Value(\"foo\") == got");
  Json::Value::~Value(&local_298);
  Json::Value::~Value(&local_270);
  JsonTest::checkEqual<bool,bool>
            ((this->super_ValueTest).super_TestCase.result_,true,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0xd0,"true == did");
  Json::Value::Value(&local_2c0,"bar");
  Json::Value::operator=(&got,&local_2c0);
  Json::Value::~Value(&local_2c0);
  bVar2 = Json::Value::removeMember(value,"some other id",&got);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  Json::Value::Value(&local_2e8,"bar");
  Json::Value::Value(&local_310,&got);
  JsonTest::checkEqual<Json::Value,Json::Value>
            (pTVar1,&local_2e8,&local_310,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0xd3,"Json::Value(\"bar\") == got");
  Json::Value::~Value(&local_310);
  Json::Value::~Value(&local_2e8);
  JsonTest::checkEqual<bool,bool>
            ((this->super_ValueTest).super_TestCase.result_,false,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
             ,0xd4,"false == did");
  Json::Value::~Value(&got);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, objects) {
  // Types
  IsCheck checks;
  checks.isObject_ = true;
  JSONTEST_ASSERT_PRED(checkIs(emptyObject_, checks));
  JSONTEST_ASSERT_PRED(checkIs(object1_, checks));

  JSONTEST_ASSERT_EQUAL(Json::objectValue, emptyObject_.type());

  // Empty object okay
  JSONTEST_ASSERT(emptyObject_.isConvertibleTo(Json::nullValue));

  // Non-empty object not okay
  JSONTEST_ASSERT(!object1_.isConvertibleTo(Json::nullValue));

  // Always okay
  JSONTEST_ASSERT(emptyObject_.isConvertibleTo(Json::objectValue));

  // Never okay
  JSONTEST_ASSERT(!emptyObject_.isConvertibleTo(Json::arrayValue));
  JSONTEST_ASSERT(!emptyObject_.isConvertibleTo(Json::intValue));
  JSONTEST_ASSERT(!emptyObject_.isConvertibleTo(Json::uintValue));
  JSONTEST_ASSERT(!emptyObject_.isConvertibleTo(Json::realValue));
  JSONTEST_ASSERT(!emptyObject_.isConvertibleTo(Json::booleanValue));
  JSONTEST_ASSERT(!emptyObject_.isConvertibleTo(Json::stringValue));

  // Access through const reference
  const Json::Value& constObject = object1_;

  JSONTEST_ASSERT_EQUAL(Json::Value(1234), constObject["id"]);
  JSONTEST_ASSERT_EQUAL(Json::Value(), constObject["unknown id"]);

  // Access through non-const reference
  JSONTEST_ASSERT_EQUAL(Json::Value(1234), object1_["id"]);
  JSONTEST_ASSERT_EQUAL(Json::Value(), object1_["unknown id"]);

  object1_["some other id"] = "foo";
  JSONTEST_ASSERT_EQUAL(Json::Value("foo"), object1_["some other id"]);
  JSONTEST_ASSERT_EQUAL(Json::Value("foo"), object1_["some other id"]);

  // Remove.
  Json::Value got;
  bool did;
  did = object1_.removeMember("some other id", &got);
  JSONTEST_ASSERT_EQUAL(Json::Value("foo"), got);
  JSONTEST_ASSERT_EQUAL(true, did);
  got = Json::Value("bar");
  did = object1_.removeMember("some other id", &got);
  JSONTEST_ASSERT_EQUAL(Json::Value("bar"), got);
  JSONTEST_ASSERT_EQUAL(false, did);
}